

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

boolean allow_category(obj *obj)

{
  char cVar1;
  short sVar2;
  boolean bVar3;
  char *pcVar4;
  
  sVar2 = urole.malenum;
  if (iflags.menu_match_tight == '\0') {
    pcVar4 = strchr(valid_menu_classes,0x75);
    if ((pcVar4 != (char *)0x0) && ((obj->field_0x4a & 4) != 0)) {
      return '\x01';
    }
    cVar1 = obj->oclass;
    pcVar4 = strchr(valid_menu_classes,(int)cVar1);
    if (pcVar4 != (char *)0x0) {
      return '\x01';
    }
    pcVar4 = strchr(valid_menu_classes,0x55);
    if (((cVar1 != '\f') && (pcVar4 != (char *)0x0)) &&
       ((((byte)*(uint *)&obj->field_0x4a >> 6 | sVar2 == 0x161) &
        (*(uint *)&obj->field_0x4a & 3) == 0) != 0)) {
      return '\x01';
    }
    pcVar4 = strchr(valid_menu_classes,0x42);
    if (((cVar1 != '\f') && (pcVar4 != (char *)0x0)) &&
       ((*(uint *)&obj->field_0x4a & 2) != 0 &&
        ((*(uint *)&obj->field_0x4a & 0x40) != 0 || sVar2 == 0x161))) {
      return '\x01';
    }
    pcVar4 = strchr(valid_menu_classes,0x43);
    if (((cVar1 != '\f') && (pcVar4 != (char *)0x0)) &&
       ((*(uint *)&obj->field_0x4a & 1) != 0 &&
        ((*(uint *)&obj->field_0x4a & 0x40) != 0 || sVar2 == 0x161))) {
      return '\x01';
    }
    pcVar4 = strchr(valid_menu_classes,0x58);
    if (((pcVar4 != (char *)0x0 && cVar1 != '\f') && sVar2 != 0x161) &&
       ((obj->field_0x4a & 0x40) == 0)) {
      return '\x01';
    }
  }
  else {
    cVar1 = obj->oclass;
    pcVar4 = strchr(valid_menu_classes,(int)cVar1);
    if (pcVar4 == (char *)0x0) {
      return '\0';
    }
    if (cVar1 == '\f') {
      return '\x01';
    }
    if ((urole.malenum == 0x161) || ((obj->field_0x4a & 0x40) != 0)) {
      pcVar4 = strchr(valid_menu_classes,0x42);
      if ((pcVar4 != (char *)0x0) && ((obj->field_0x4a & 2) != 0)) {
        return '\x01';
      }
      pcVar4 = strchr(valid_menu_classes,0x43);
      if ((pcVar4 != (char *)0x0) && ((obj->field_0x4a & 1) != 0)) {
        return '\x01';
      }
      pcVar4 = strchr(valid_menu_classes,0x55);
      if ((pcVar4 != (char *)0x0) && ((obj->field_0x4a & 3) == 0)) {
        return '\x01';
      }
    }
    else {
      pcVar4 = strchr(valid_menu_classes,0x58);
      if (pcVar4 != (char *)0x0) {
        return '\x01';
      }
    }
    pcVar4 = strchr(valid_menu_classes,0x75);
    if ((pcVar4 != (char *)0x0) && ((obj->field_0x4a & 4) != 0)) {
      return '\x01';
    }
  }
  pcVar4 = strchr(valid_menu_classes,0x49);
  if ((pcVar4 != (char *)0x0) && (bVar3 = not_fully_identified_core(obj,'\x01'), bVar3 != '\0')) {
    return '\x01';
  }
  return '\0';
}

Assistant:

boolean allow_category(const struct obj *obj)
{
	if (iflags.menu_match_tight) {
	    /* object class match failure */
	    if (!strchr(valid_menu_classes, obj->oclass))
		return FALSE;

	    /* none of the below apply to gold */
	    if (obj->oclass == COIN_CLASS)
		return TRUE;

	    /* match BUC flags */
	    if (Role_if(PM_PRIEST) || obj->bknown) {
		if (strchr(valid_menu_classes, 'B') && obj->blessed)
		    return TRUE;
		if (strchr(valid_menu_classes, 'C') && obj->cursed)
		    return TRUE;
		if (strchr(valid_menu_classes, 'U') && !obj->blessed && !obj->cursed)
		    return TRUE;
	    } else {
		if (strchr(valid_menu_classes, 'X'))
		    return TRUE;
	    }

	    /* match unpaid or unIDed */
	    if ((strchr(valid_menu_classes, 'u') && obj->unpaid) ||
		(strchr(valid_menu_classes, 'I') &&
		 not_fully_identified_core(obj, TRUE)))
		return TRUE;

	    return FALSE;
	} else {
	    /* Classic (loose) matching behavior. */
	    boolean priest = Role_if(PM_PRIEST);
	    if ((strchr(valid_menu_classes,'u') && obj->unpaid) ||
		strchr(valid_menu_classes, obj->oclass))
		return TRUE;
	    else if (strchr(valid_menu_classes,'U') && obj->oclass != COIN_CLASS &&
		     (priest || obj->bknown) && !obj->blessed && !obj->cursed)
		return TRUE;
	    else if (strchr(valid_menu_classes,'B') && obj->oclass != COIN_CLASS &&
		     (priest || obj->bknown) && obj->blessed)
		return TRUE;
	    else if (strchr(valid_menu_classes,'C') && obj->oclass != COIN_CLASS &&
		     (priest || obj->bknown) && obj->cursed)
		return TRUE;
	    else if (strchr(valid_menu_classes,'X') && obj->oclass != COIN_CLASS &&
		     !(priest || obj->bknown))
		return TRUE;
	    else if (strchr(valid_menu_classes,'I') &&
		     not_fully_identified_core(obj, TRUE))
		return TRUE;
	    else
		return FALSE;
	}
}